

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSet::span(UnicodeSet *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  UBool UVar1;
  int32_t iVar2;
  UChar *pUVar3;
  long lVar4;
  uint c;
  int iVar5;
  UnicodeSetStringSpan strSpan;
  UnicodeSetStringSpan UStack_148;
  
  iVar2 = (int32_t)&UStack_148;
  if ((length < 1) || (this->bmpSet == (BMPSet *)0x0)) {
    if (length < 0) {
      length = u_strlen_63(s);
    }
    if (length == 0) {
      iVar2 = 0;
    }
    else {
      if (this->stringSpan != (UnicodeSetStringSpan *)0x0) {
        iVar2 = UnicodeSetStringSpan::span(this->stringSpan,s,length,spanCondition);
        return iVar2;
      }
      if (this->strings->count != 0) {
        UnicodeSetStringSpan::UnicodeSetStringSpan
                  (&UStack_148,this,this->strings,0x2a - (spanCondition == USET_SPAN_NOT_CONTAINED))
        ;
        if (UStack_148.maxLength16 != 0) {
          iVar2 = UnicodeSetStringSpan::span(&UStack_148,s,length,spanCondition);
        }
        UnicodeSetStringSpan::~UnicodeSetStringSpan(&UStack_148);
        if (UStack_148.maxLength16 != 0) {
          return iVar2;
        }
      }
      iVar2 = 0;
      do {
        iVar5 = iVar2 + 1;
        c = (uint)(ushort)s[iVar2];
        if ((iVar5 != length && (c & 0xfc00) == 0xd800) &&
           (lVar4 = (long)iVar5, ((ushort)s[lVar4] & 0xfc00) == 0xdc00)) {
          iVar5 = iVar2 + 2;
          c = (uint)(ushort)s[iVar2] * 0x400 + (uint)(ushort)s[lVar4] + 0xfca02400;
        }
        UVar1 = contains(this,c);
      } while (((uint)(spanCondition != USET_SPAN_NOT_CONTAINED) == (int)UVar1) &&
              (iVar2 = iVar5, iVar5 < length));
    }
  }
  else {
    pUVar3 = BMPSet::span(this->bmpSet,s,s + (uint)length,spanCondition);
    iVar2 = (int32_t)((ulong)((long)pUVar3 - (long)s) >> 1);
  }
  return iVar2;
}

Assistant:

int32_t UnicodeSet::span(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(length>0 && bmpSet!=NULL) {
        return (int32_t)(bmpSet->span(s, s+length, spanCondition)-s);
    }
    if(length<0) {
        length=u_strlen(s);
    }
    if(length==0) {
        return 0;
    }
    if(stringSpan!=NULL) {
        return stringSpan->span(s, length, spanCondition);
    } else if(!strings->isEmpty()) {
        uint32_t which= spanCondition==USET_SPAN_NOT_CONTAINED ?
                            UnicodeSetStringSpan::FWD_UTF16_NOT_CONTAINED :
                            UnicodeSetStringSpan::FWD_UTF16_CONTAINED;
        UnicodeSetStringSpan strSpan(*this, *strings, which);
        if(strSpan.needsStringSpanUTF16()) {
            return strSpan.span(s, length, spanCondition);
        }
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    UChar32 c;
    int32_t start=0, prev=0;
    do {
        U16_NEXT(s, start, length, c);
        if(spanCondition!=contains(c)) {
            break;
        }
    } while((prev=start)<length);
    return prev;
}